

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::FollowLinkEntry(cmComputeLinkDepends *this,BFSEntry qe)

{
  bool bVar1;
  TargetType TVar2;
  reference pvVar3;
  cmLinkInterface *iface_00;
  pointer pvVar4;
  reference item;
  int local_9c;
  cmLinkItem *oi;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range3_1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_true>
  local_68;
  const_iterator runtimeEntries;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *language;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  bool isIface;
  cmLinkInterface *iface;
  LinkEntry *entry;
  int depender_index;
  cmComputeLinkDepends *this_local;
  BFSEntry qe_local;
  
  this_local._4_4_ = qe.GroupIndex;
  this_local._0_4_ = qe.Index;
  if (this_local._4_4_ == -1) {
    local_9c = (int)this_local;
  }
  else {
    local_9c = this_local._4_4_;
  }
  pvVar3 = std::
           vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ::operator[](&this->EntryList,(long)(int)this_local);
  if (pvVar3->Target == (cmGeneratorTarget *)0x0) {
    AddVarLinkEntries(this,local_9c,qe.LibDepends);
  }
  else {
    iface_00 = cmGeneratorTarget::GetLinkInterface(pvVar3->Target,&this->Config,this->Target);
    if (iface_00 != (cmLinkInterface *)0x0) {
      TVar2 = cmGeneratorTarget::GetType(pvVar3->Target);
      AddLinkEntries<cmLinkItem>
                (this,local_9c,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface_00);
      AddLinkObjects(this,&(iface_00->super_cmLinkInterfaceLibraries).Objects);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&iface_00->Languages);
      language = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&iface_00->Languages);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&language), bVar1) {
        runtimeEntries.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_true>
        ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_true>
                   )__gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        local_68._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>_>
             ::find(&iface_00->LanguageRuntimeLibraries,
                    (key_type *)
                    runtimeEntries.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_true>
                    ._M_cur);
        __range3_1 = (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>_>
                     ::end(&iface_00->LanguageRuntimeLibraries);
        bVar1 = std::__detail::operator!=
                          (&local_68,
                           (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_true>
                            *)&__range3_1);
        if (bVar1) {
          pvVar4 = std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_false,_true>
                                 *)&local_68);
          AddLinkEntries<cmLinkItem>(this,local_9c,&pvVar4->second);
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      if (TVar2 != INTERFACE_LIBRARY) {
        FollowSharedDeps(this,local_9c,iface_00,false);
        __end3_1 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                             (&iface_00->WrongConfigLibraries);
        oi = (cmLinkItem *)
             std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                       (&iface_00->WrongConfigLibraries);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                   *)&oi), bVar1) {
          item = __gnu_cxx::
                 __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                 ::operator*(&__end3_1);
          CheckWrongConfigItem(this,item);
          __gnu_cxx::
          __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
          ::operator++(&__end3_1);
        }
      }
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::FollowLinkEntry(BFSEntry qe)
{
  // Get this entry representation.
  int depender_index = qe.GroupIndex == -1 ? qe.Index : qe.GroupIndex;
  LinkEntry const& entry = this->EntryList[qe.Index];

  // Follow the item's dependencies.
  if (entry.Target) {
    // Follow the target dependencies.
    if (cmLinkInterface const* iface =
          entry.Target->GetLinkInterface(this->Config, this->Target)) {
      const bool isIface =
        entry.Target->GetType() == cmStateEnums::INTERFACE_LIBRARY;
      // This target provides its own link interface information.
      this->AddLinkEntries(depender_index, iface->Libraries);
      this->AddLinkObjects(iface->Objects);
      for (auto const& language : iface->Languages) {
        auto runtimeEntries = iface->LanguageRuntimeLibraries.find(language);
        if (runtimeEntries != iface->LanguageRuntimeLibraries.end()) {
          this->AddLinkEntries(depender_index, runtimeEntries->second);
        }
      }

      if (isIface) {
        return;
      }

      // Handle dependent shared libraries.
      this->FollowSharedDeps(depender_index, iface);

      // Support for CMP0003.
      for (cmLinkItem const& oi : iface->WrongConfigLibraries) {
        this->CheckWrongConfigItem(oi);
      }
    }
  } else {
    // Follow the old-style dependency list.
    this->AddVarLinkEntries(depender_index, qe.LibDepends);
  }
}